

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

shared_ptr<chrono::ChLinkMotorRotationTorque> __thiscall
chrono::curiosity::AddMotorTorque
          (curiosity *this,shared_ptr<chrono::ChBody> *body1,shared_ptr<chrono::ChBody> *body2,
          shared_ptr<chrono::curiosity::CuriosityChassis> *chassis,ChVector<double> *rel_pos,
          ChQuaternion<double> *rel_rot)

{
  double dVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long *plVar5;
  element_type *peVar6;
  long lVar7;
  ChFrameMoving<double> *Fa;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  shared_ptr<chrono::ChLinkMotorRotationTorque> sVar11;
  ChFrame<double> X_GC;
  element_type *local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  element_type *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  undefined8 local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1f0;
  shared_ptr<chrono::curiosity::CuriosityChassis> *local_1e0;
  shared_ptr<chrono::ChBody> *local_1d8;
  shared_ptr<chrono::ChBody> *local_1d0;
  ChFrame<double> local_1c8;
  undefined1 local_140 [40];
  double local_118;
  double dStack_110;
  double local_108;
  ChMatrix33<double> local_100;
  undefined **local_b8;
  double local_b0;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double local_90;
  double dStack_88;
  double local_80;
  double local_78;
  double dStack_70;
  double dStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double local_38;
  
  peVar2 = (chassis->
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = (peVar2->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar2->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_1e0 = chassis;
  local_1d8 = body1;
  local_1d0 = body2;
  Fa = (ChFrameMoving<double> *)(**(code **)(*(long *)peVar3 + 0x1f0))();
  local_140._0_8_ = &PTR__ChFrame_0017db90;
  dVar1 = rel_pos->m_data[2];
  auVar9._8_8_ = dVar1;
  auVar9._0_8_ = dVar1;
  auVar9._16_8_ = dVar1;
  auVar9._24_8_ = dVar1;
  auVar9 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])rel_pos->m_data),auVar9,0x30);
  dVar1 = rel_rot->m_data[0];
  auVar10._8_8_ = dVar1;
  auVar10._0_8_ = dVar1;
  auVar10._16_8_ = dVar1;
  auVar10._24_8_ = dVar1;
  local_140._8_32_ = vblendps_avx(auVar9,auVar10,0xc0);
  local_118 = rel_rot->m_data[1];
  dStack_110 = rel_rot->m_data[2];
  local_108 = rel_rot->m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_100,rel_rot);
  operator*(&local_1c8,Fa,(ChFrame<double> *)local_140);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChLinkMotorRotationTorque,std::allocator<chrono::ChLinkMotorRotationTorque>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),
             (ChLinkMotorRotationTorque **)this,
             (allocator<chrono::ChLinkMotorRotationTorque> *)local_140);
  plVar5 = *(long **)this;
  local_208 = (local_1d8->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (local_208 != (element_type *)0x0) {
    local_208 = local_208 + 0x78;
  }
  local_200 = (local_1d8->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_200->_M_use_count = local_200->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_200->_M_use_count = local_200->_M_use_count + 1;
    }
  }
  peVar6 = (local_1d0->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_218 = peVar6 + 0x78;
  if (peVar6 == (element_type *)0x0) {
    local_218 = (element_type *)0x0;
  }
  local_210 = (local_1d0->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_210->_M_use_count = local_210->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_210->_M_use_count = local_210->_M_use_count + 1;
    }
  }
  local_b8 = &PTR__ChFrame_0017db90;
  local_b0 = local_1c8.coord.pos.m_data[0];
  dStack_a8 = local_1c8.coord.pos.m_data[1];
  dStack_a0 = local_1c8.coord.pos.m_data[2];
  dStack_98 = local_1c8.coord.rot.m_data[0];
  local_90 = local_1c8.coord.rot.m_data[1];
  dStack_88 = local_1c8.coord.rot.m_data[2];
  local_80 = local_1c8.coord.rot.m_data[3];
  local_38 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_78 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dStack_70 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
  ;
  dStack_68 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
  ;
  dStack_60 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
  ;
  dStack_58 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
  ;
  dStack_50 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
  ;
  dStack_48 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
  ;
  dStack_40 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
  ;
  (**(code **)(*plVar5 + 0x240))(plVar5,&local_208,&local_218);
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  peVar2 = (local_1e0->
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = (peVar2->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar2->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_1f8 = *(undefined8 *)this;
  p_Stack_1f0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  plVar5 = *(long **)(peVar3 + 0x38);
  lVar7 = *(long *)(this + 8);
  if (lVar7 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar7 + 8) = *(int *)(lVar7 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar7 + 8) = *(int *)(lVar7 + 8) + 1;
    }
  }
  (**(code **)(*plVar5 + 0x138))(plVar5,&local_1f8);
  _Var8._M_pi = extraout_RDX;
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
    _Var8._M_pi = extraout_RDX_00;
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    _Var8._M_pi = extraout_RDX_01;
  }
  sVar11.super___shared_ptr<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  sVar11.super___shared_ptr<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkMotorRotationTorque>)
         sVar11.super___shared_ptr<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkMotorRotationTorque> AddMotorTorque(std::shared_ptr<ChBody> body1,
                                                          std::shared_ptr<ChBody> body2,
                                                          std::shared_ptr<CuriosityChassis> chassis,
                                                          const ChVector<>& rel_pos,
                                                          const ChQuaternion<>& rel_rot) {
    // Express relative frame in global
    ChFrame<> X_GC = chassis->GetBody()->GetFrame_REF_to_abs() * ChFrame<>(rel_pos, rel_rot);

    // Create motor (actuated DOF about Z axis of X_GC frame)
    auto motor = chrono_types::make_shared<ChLinkMotorRotationTorque>();
    motor->Initialize(body1, body2, X_GC);
    chassis->GetBody()->GetSystem()->AddLink(motor);

    return motor;
}